

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

Path * tinyusdz::Path::make_root_path(void)

{
  Path *in_RDI;
  allocator local_61;
  string local_60;
  allocator local_39;
  string local_38;
  undefined1 local_11;
  Path *p;
  
  local_11 = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,"/",&local_39);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_60,"",&local_61);
  Path(in_RDI,&local_38,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  ::std::__cxx11::string::operator=((string *)&in_RDI->_element,"");
  in_RDI->_valid = true;
  return in_RDI;
}

Assistant:

static Path make_root_path() {
    Path p = Path("/", "");
    // elementPath is empty for root.
    p._element = "";
    p._valid = true;
    return p;
  }